

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries
          (SpreadVolatileSemantics *this,uint32_t var_id,
          function<bool_(spvtools::opt::Instruction_*)> *handle_load,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *function_ids)

{
  uint32_t *puVar1;
  uint32_t id;
  IRContext *this_00;
  _Manager_type p_Var2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  _func_void *p_Var6;
  uint32_t ptr_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> worklist;
  uint32_t local_cc;
  uint32_t *local_c8;
  uint32_t *puStack_c0;
  uint32_t *local_b8;
  DefUseManager *local_b0;
  SpreadVolatileSemantics *local_a8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_a0;
  SpreadVolatileSemantics *local_98;
  uint32_t **ppuStack_90;
  uint32_t *local_88;
  _Any_data local_80;
  _Manager_type local_70;
  _Invoker_type p_Stack_68;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_c8 = (uint32_t *)0x0;
  puStack_c0 = (uint32_t *)0x0;
  local_b8 = (uint32_t *)0x0;
  local_a0 = function_ids;
  local_c8 = (uint32_t *)operator_new(4);
  puStack_c0 = local_c8 + 1;
  *local_c8 = var_id;
  this_00 = (this->super_Pass).context_;
  local_b8 = puStack_c0;
  local_a8 = this;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  local_b0 = (this_00->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  do {
    puVar4 = puStack_c0;
    puVar3 = local_c8;
    if (local_c8 == puStack_c0) break;
    puVar1 = puStack_c0 + -1;
    id = puStack_c0[-1];
    local_98 = local_a8;
    ppuStack_90 = &local_c8;
    local_88 = &local_cc;
    local_70 = (_Manager_type)0x0;
    p_Stack_68 = (_Invoker_type)0x0;
    local_80._M_unused._M_object = (void *)0x0;
    local_80._8_8_ = 0;
    p_Var2 = (handle_load->super__Function_base)._M_manager;
    local_cc = id;
    puStack_c0 = puVar1;
    if (p_Var2 != (_Manager_type)0x0) {
      (*p_Var2)(&local_80,(_Any_data *)handle_load,__clone_functor);
      p_Stack_68 = handle_load->_M_invoker;
      local_70 = (handle_load->super__Function_base)._M_manager;
    }
    local_60 = local_a0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    p_Var6 = (_func_void *)operator_new(0x40);
    *(SpreadVolatileSemantics **)p_Var6 = local_98;
    *(uint32_t ***)(p_Var6 + 8) = ppuStack_90;
    *(uint32_t **)(p_Var6 + 0x10) = local_88;
    *(undefined8 *)(p_Var6 + 0x18) = 0;
    *(undefined8 *)(p_Var6 + 0x20) = 0;
    *(undefined8 *)(p_Var6 + 0x28) = 0;
    *(undefined8 *)(p_Var6 + 0x30) = 0;
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)((_Any_data *)(p_Var6 + 0x18),&local_80,__clone_functor);
      *(_Invoker_type *)(p_Var6 + 0x30) = p_Stack_68;
      *(_Manager_type *)(p_Var6 + 0x28) = local_70;
    }
    *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      **)(p_Var6 + 0x38) = local_60;
    pcStack_40 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:213:17)>
               ::_M_manager;
    local_58._M_unused._0_8_ = (undefined8)p_Var6;
    bVar5 = analysis::DefUseManager::WhileEachUser
                      (local_b0,id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_70 != (_Manager_type)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
  } while (bVar5);
  if (local_c8 != (uint32_t *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  return puVar3 == puVar4;
}

Assistant:

bool SpreadVolatileSemantics::VisitLoadsOfPointersToVariableInEntries(
    uint32_t var_id, const std::function<bool(Instruction*)>& handle_load,
    const std::unordered_set<uint32_t>& function_ids) {
  std::vector<uint32_t> worklist({var_id});
  auto* def_use_mgr = context()->get_def_use_mgr();
  while (!worklist.empty()) {
    uint32_t ptr_id = worklist.back();
    worklist.pop_back();
    bool finish_traversal = !def_use_mgr->WhileEachUser(
        ptr_id, [this, &worklist, &ptr_id, handle_load,
                 &function_ids](Instruction* user) {
          BasicBlock* block = context()->get_instr_block(user);
          if (block == nullptr ||
              function_ids.find(block->GetParent()->result_id()) ==
                  function_ids.end()) {
            return true;
          }

          if (user->opcode() == spv::Op::OpAccessChain ||
              user->opcode() == spv::Op::OpInBoundsAccessChain ||
              user->opcode() == spv::Op::OpPtrAccessChain ||
              user->opcode() == spv::Op::OpInBoundsPtrAccessChain ||
              user->opcode() == spv::Op::OpCopyObject) {
            if (ptr_id == user->GetSingleWordInOperand(0))
              worklist.push_back(user->result_id());
            return true;
          }

          if (user->opcode() != spv::Op::OpLoad) {
            return true;
          }

          return handle_load(user);
        });
    if (finish_traversal) return false;
  }
  return true;
}